

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O2

bool ON_SubDVertex::Read(ON_BinaryArchive *archive,ON_SubD *subd,ON_SubDVertex **vertex)

{
  unsigned_short uVar1;
  bool bVar2;
  ON_SubDVertexTag vertex_tag_00;
  int iVar3;
  ON_SubDimple *this;
  ON_SubDVertex *pOVar4;
  long lVar5;
  uint uVar6;
  ON_SubDSectorSurfacePoint *pOVar7;
  ON_SubDComponentBase *pOVar8;
  ON_SubDComponentBase *pOVar9;
  ON_SubDSectorSurfacePoint *pOVar10;
  ON_SubDVertex *pOVar11;
  byte bVar12;
  unsigned_short face_count;
  uchar vertex_tag;
  unsigned_short edge_count;
  uchar c;
  uint limit_point_count;
  ON__UINT_PTR local_110;
  double P [3];
  ON_SubDSectorSurfacePoint limit_point;
  ON_SubDComponentBase base;
  
  bVar12 = 0;
  *vertex = (ON_SubDVertex *)0x0;
  this = ON_SubD::SubDimple(subd);
  if (this == (ON_SubDimple *)0x0) goto LAB_005fa774;
  pOVar8 = &ON_SubDComponentBase::Unset;
  pOVar9 = &base;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pOVar9->m_subd_point1 = pOVar8->m_subd_point1;
    pOVar8 = (ON_SubDComponentBase *)((long)pOVar8 + ((ulong)bVar12 * -2 + 1) * 8);
    pOVar9 = (ON_SubDComponentBase *)((long)pOVar9 + (ulong)bVar12 * -0x10 + 8);
  }
  edge_count = 0;
  vertex_tag = '\0';
  face_count = 0;
  bVar2 = ReadBase(archive,&base);
  if ((((!bVar2) || (bVar2 = ON_BinaryArchive::ReadChar(archive,&vertex_tag), !bVar2)) ||
      (bVar2 = Internal_ReadDouble3(archive,P), !bVar2)) ||
     ((bVar2 = ON_BinaryArchive::ReadShort(archive,&edge_count), !bVar2 ||
      (bVar2 = ON_BinaryArchive::ReadShort(archive,&face_count), uVar1 = face_count, !bVar2))))
  goto LAB_005fa774;
  c = '\0';
  bVar2 = ON_BinaryArchive::ReadChar(archive,&c);
  if (bVar2) {
    if (c == '\0') {
LAB_005fa68b:
      vertex_tag_00 = ON_SubD::VertexTagFromUnsigned((uint)vertex_tag);
      uVar6 = ON_SubDComponentBase::SubdivisionLevel(&base);
      pOVar4 = ON_SubDimple::AllocateVertex
                         (this,base.m_id,vertex_tag_00,uVar6,P,(uint)edge_count,(uint)face_count);
      if (pOVar4 != (ON_SubDVertex *)0x0) {
        pOVar8 = &base;
        pOVar11 = pOVar4;
        for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pOVar11->super_ON_SubDComponentBase).m_subd_point1 = pOVar8->m_subd_point1;
          pOVar8 = (ON_SubDComponentBase *)((long)pOVar8 + (ulong)bVar12 * -0x10 + 8);
          pOVar11 = (ON_SubDVertex *)((long)pOVar11 + (ulong)bVar12 * -0x10 + 8);
        }
        bVar2 = Internal_ReadEdgePtrList
                          (archive,&edge_count,pOVar4->m_edge_capacity,pOVar4->m_edges,0,
                           (ON_SubDEdgePtr *)0x0);
        if (bVar2) {
          pOVar4->m_edge_count = edge_count;
          bVar2 = Internal_ReadFacePtrList
                            (archive,&face_count,pOVar4->m_face_capacity,
                             (ON_SubDFacePtr *)pOVar4->m_faces,0,(ON_SubDFacePtr *)0x0);
          if (bVar2) {
            pOVar4->m_face_count = face_count;
            *vertex = pOVar4;
            iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
            if (0x45 < iVar3) {
              bVar2 = Internal_FinishReadingComponentAdditions(archive);
              return bVar2;
            }
            limit_point.m_limitP[0]._0_1_ = '\x01';
            bVar2 = ON_BinaryArchive::ReadChar(archive,(ON__UINT8 *)&limit_point);
            if ((bVar2) && (limit_point.m_limitP[0]._0_1_ == '\0')) {
              return true;
            }
          }
        }
      }
      goto LAB_005fa774;
    }
    limit_point_count = 0;
    bVar2 = ON_BinaryArchive::ReadInt(archive,&limit_point_count);
    if ((bVar2) && (limit_point_count - 1 < (uint)uVar1)) {
      for (uVar6 = 0; uVar6 < limit_point_count; uVar6 = uVar6 + 1) {
        pOVar7 = &ON_SubDSectorSurfacePoint::Unset;
        pOVar10 = &limit_point;
        for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
          pOVar10->m_limitP[0] = pOVar7->m_limitP[0];
          pOVar7 = (ON_SubDSectorSurfacePoint *)((long)pOVar7 + ((ulong)bVar12 * -2 + 1) * 8);
          pOVar10 = (ON_SubDSectorSurfacePoint *)((long)pOVar10 + (ulong)bVar12 * -0x10 + 8);
        }
        bVar2 = Internal_ReadDouble3(archive,limit_point.m_limitP);
        if ((((!bVar2) || (bVar2 = Internal_ReadDouble3(archive,limit_point.m_limitT1), !bVar2)) ||
            (bVar2 = Internal_ReadDouble3(archive,limit_point.m_limitT2), !bVar2)) ||
           ((bVar2 = Internal_ReadDouble3(archive,limit_point.m_limitN), !bVar2 ||
            (bVar2 = Internal_ReadArchiveIdAndFlagsIntoComponentPtr(archive,&local_110), !bVar2))))
        break;
      }
      if (limit_point_count == uVar6) goto LAB_005fa68b;
    }
  }
  ON_SubDIncrementErrorCount();
LAB_005fa774:
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDVertex::Read(
  class ON_BinaryArchive& archive,
  class ON_SubD& subd,
  class ON_SubDVertex*& vertex
  )
{
  vertex = nullptr;

  for (;;)
  {
    ON_SubDimple* subdimple = const_cast<ON_SubDimple*>(subd.SubDimple());
    if ( nullptr == subdimple)
      break;

    ON_SubDComponentBase base = ON_SubDComponentBase::Unset;
    unsigned char vertex_tag = 0;
    //unsigned char vertex_edge_order = 0;
    //unsigned char vertex_facet_type = 0;
    double P[3];
    unsigned short edge_count = 0;
    unsigned short face_count = 0;

    //ON_SimpleArray<ON_SubDSectorSurfacePoint> limit_points;

    if (!ReadBase(archive,base))
      break;
    if (!archive.ReadChar(&vertex_tag))
      break;
    if (!Internal_ReadDouble3(archive,P))
      break;
    if (!archive.ReadShort(&edge_count))
      break;
    if (!archive.ReadShort(&face_count))
      break;

    if (!Internal_IgnoreSavedLimitPointList(archive, face_count))
      break;

    ON_SubDVertex* v = subdimple->AllocateVertex(
      base.m_id, // serialization must preserve ON_SubDVertex.m_id
      ON_SubD::VertexTagFromUnsigned(vertex_tag),
      base.SubdivisionLevel(),
      P,
      edge_count,
      face_count
      );

    if ( nullptr == v )
      break;

    v->ON_SubDComponentBase::operator=(base);

    if (!Internal_ReadEdgePtrList(archive,edge_count,v->m_edge_capacity,v->m_edges,0,nullptr))
      break;
    v->m_edge_count = edge_count;

    if (!Internal_ReadFacePtrList(archive,face_count,v->m_face_capacity,(ON_SubDFacePtr*)v->m_faces,0,nullptr))
      break;
    v->m_face_count = face_count;

    //for (unsigned int i = 0; i < limit_points.UnsignedCount(); i++)
    //{
    //  ON_SubDSectorSurfacePoint limit_point = limit_points[i];
    //  limit_point.m_next_sector_limit_point = (const ON_SubDSectorSurfacePoint*)1U; // skips checks
    //  if (false == v->SetSavedSurfacePoint( true, limit_point))
    //  {
    //    v->ClearSavedSurfacePoints();
    //    break;
    //  }
    //}

    vertex = v;

    if (archive.Archive3dmVersion() < 70)
    {
      unsigned char sz = 1;
      if (!archive.ReadChar(&sz) || 0 != sz)
        break;
      return true;
    }

    // read additions
    return Internal_FinishReadingComponentAdditions(archive);
  }
  return ON_SUBD_RETURN_ERROR(false);
}